

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDataCollectionAddField(FmsDataCollection dc,char *field_name,FmsField *field)

{
  ulong uVar1;
  int iVar2;
  char *str;
  void *pvVar3;
  char **str_copy_p;
  undefined8 *in_RDX;
  long in_RDI;
  FmsField new_field;
  FmsInt nc;
  FmsField *fields;
  FmsInt num_fields;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RDX == (undefined8 *)0x0) {
    local_4 = 2;
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 0x28);
    pvVar3 = *(void **)(in_RDI + 0x30);
    str = (char *)NextPow2(uVar1 + 1);
    if (uVar1 <= (ulong)str >> 1) {
      pvVar3 = realloc(pvVar3,(long)str << 3);
      if (pvVar3 == (void *)0x0) {
        return 3;
      }
      *(void **)(in_RDI + 0x30) = pvVar3;
    }
    str_copy_p = (char **)calloc(1,0x30);
    if (str_copy_p == (char **)0x0) {
      local_4 = 3;
    }
    else {
      iVar2 = FmsCopyString(str,str_copy_p);
      if (iVar2 == 0) {
        *(ulong *)(in_RDI + 0x28) = uVar1 + 1;
        *(char ***)(*(long *)(in_RDI + 0x30) + uVar1 * 8) = str_copy_p;
        *in_RDX = str_copy_p;
        local_4 = 0;
      }
      else {
        free(str_copy_p);
        local_4 = 3;
      }
    }
  }
  return local_4;
}

Assistant:

int FmsDataCollectionAddField(FmsDataCollection dc, const char *field_name,
                              FmsField *field) {
  if (!dc) { E_RETURN(1); }
  if (!field) { E_RETURN(2); }
  const FmsInt num_fields = dc->num_fields;
  FmsField *fields = dc->fields;
  // Reallocate dc->fields, if necessary
  const FmsInt nc = NextPow2(num_fields + 1);
  if (num_fields <= nc/2) {
    fields = realloc(fields, nc*sizeof(*fields));
    if (fields == NULL) { E_RETURN(3); }
    dc->fields = fields;
  }
  FmsField new_field;
  new_field = calloc(1, sizeof(*new_field));
  if (new_field == NULL) { E_RETURN(3); }
  // On error, call free(new_field)
  if (FmsCopyString(field_name, &new_field->name)) {
    free(new_field); E_RETURN(3);
  }
  // Update the field
  dc->num_fields = num_fields + 1;
  dc->fields[num_fields] = new_field;
  *field = new_field;
  return 0;
}